

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::taylor_inplace_multiplier<double,_1,_5,_9,_0>::mul(double *p1,double *p2)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  
  dVar4 = *p2 * p1[5];
  p1[5] = dVar4;
  lVar2 = 0x28;
  pdVar3 = p1;
  do {
    dVar4 = dVar4 + *pdVar3 * *(double *)((long)p2 + lVar2);
    p1[5] = dVar4;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0);
  dVar4 = *p2 * p1[4];
  p1[4] = dVar4;
  lVar2 = 0x20;
  pdVar3 = p1;
  do {
    dVar4 = dVar4 + *pdVar3 * *(double *)((long)p2 + lVar2);
    p1[4] = dVar4;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0);
  dVar4 = *p2 * p1[3];
  p1[3] = dVar4;
  lVar2 = 0x18;
  pdVar3 = p1;
  do {
    dVar4 = dVar4 + *pdVar3 * *(double *)((long)p2 + lVar2);
    p1[3] = dVar4;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0);
  dVar4 = *p2 * p1[2];
  p1[2] = dVar4;
  lVar2 = 2;
  pdVar3 = p1;
  do {
    dVar4 = dVar4 + *pdVar3 * p2[lVar2];
    p1[2] = dVar4;
    lVar2 = lVar2 + -1;
    pdVar3 = pdVar3 + 1;
  } while (lVar2 == 1);
  dVar4 = *p2;
  dVar1 = p1[1];
  p1[1] = dVar4 * dVar1;
  p1[1] = p2[1] * *p1 + dVar4 * dVar1;
  *p1 = *p1 * *p2;
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    p1[Ndeg] *= p2[0];
    if (Ndeg <= Ndeg2) {
      for (int i = 0; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    } else {
      for (int i = Ndeg - Ndeg2; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    }
    taylor_inplace_multiplier<numtype, 1, Ndeg - 1, Ndeg2, 0>::mul(p1, p2);
  }